

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O2

ptr<snapshot_sync_req> __thiscall
nuraft::snapshot_sync_req::deserialize(snapshot_sync_req *this,buffer_serializer *bs)

{
  ulong uVar1;
  void *__src;
  size_t sVar2;
  byte *__dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<snapshot_sync_req> pVar3;
  bool done;
  ptr<buffer> b;
  ulong offset;
  ptr<snapshot> snp;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<nuraft::buffer> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  snapshot::deserialize
            ((snapshot *)
             &local_38.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,bs
            );
  local_38.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)buffer_serializer::get_u64(bs);
  buffer_serializer::get_u8(bs);
  __src = buffer_serializer::data(bs);
  local_58._M_ptr = (buffer *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = bs->pos_;
  sVar2 = buffer_serializer::size(bs);
  if (uVar1 < sVar2) {
    sVar2 = buffer_serializer::size(bs);
    sVar2 = sVar2 - bs->pos_;
    buffer::alloc((buffer *)&local_48,sVar2);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    __dest = buffer::data(local_58._M_ptr);
    memcpy(__dest,__src,sVar2);
  }
  else {
    buffer::alloc((buffer *)&local_48,0);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::
  make_shared<nuraft::snapshot_sync_req,std::shared_ptr<nuraft::snapshot>&,unsigned_long&,std::shared_ptr<nuraft::buffer>&,bool&>
            (&this->snapshot_,
             (unsigned_long *)
             &local_38.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38,(bool *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  pVar3.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot_sync_req>)
         pVar3.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer_serializer& bs) {
    ptr<snapshot> snp(snapshot::deserialize(bs));
    ulong offset = bs.get_u64();
    bool done = bs.get_u8() == 1;
    byte* src = (byte*)bs.data();
    ptr<buffer> b;
    if (bs.pos() < bs.size()) {
        size_t sz = bs.size() - bs.pos();
        b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
    }
    else {
        b = buffer::alloc(0);
    }

    return cs_new<snapshot_sync_req>(snp, offset, b, done);
}